

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_pool.h
# Opt level: O3

example * __thiscall
VW::object_pool<example,_example_initializer>::get_object
          (object_pool<example,_example_initializer> *this)

{
  example *peVar1;
  _Elt_pointer ppeVar2;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_20;
  
  local_20._M_owns = false;
  local_20._M_device = &this->m_lock;
  std::unique_lock<std::mutex>::lock(&local_20);
  local_20._M_owns = true;
  ppeVar2 = (this->m_pool).c.super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  if ((this->m_pool).c.super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur == ppeVar2) {
    new_chunk(this,this->m_chunk_size);
    ppeVar2 = (this->m_pool).c.super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur;
  }
  peVar1 = *ppeVar2;
  std::deque<example_*,_std::allocator<example_*>_>::pop_front(&(this->m_pool).c);
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return peVar1;
}

Assistant:

T* get_object()
  {
    std::unique_lock<std::mutex> lock(m_lock);
    if (m_pool.empty())
    {
      new_chunk(m_chunk_size);
    }

    auto obj = m_pool.front();
    m_pool.pop();
    return obj;
  }